

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Clara::CommandLine<Catch::ConfigData>::usage
          (CommandLine<Catch::ConfigData> *this,ostream *os,string *procName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"usage:\n  ");
  poVar1 = std::operator<<(poVar1,(string *)procName);
  std::operator<<(poVar1," ");
  argSynopsis(this,os);
  if ((this->m_options).
      super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_options).
      super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(os," [options]\n\nwhere options are: \n");
    optUsage(this,os,2,0x50);
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void usage( std::ostream& os, std::string const& procName ) const {
            os << "usage:\n  " << procName << " ";
            argSynopsis( os );
            if( !m_options.empty() ) {
                os << " [options]\n\nwhere options are: \n";
                optUsage( os, 2 );
            }
            os << "\n";
        }